

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t HUF_decompress4X2_usingDTable_internal_fast
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 HUF_DecompressFastLoopFn loopFn)

{
  long *plVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  long lVar4;
  long lVar5;
  BYTE *pStart;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long *plVar10;
  int iVar11;
  uint uVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  long lVar15;
  ulong uVar16;
  bool bVar17;
  HUF_DecompressFastArgs args;
  size_t local_e8;
  HUF_DecompressFastArgs local_c8;
  
  local_e8 = HUF_DecompressFastArgs_init(&local_c8,dst,dstSize,cSrc,cSrcSize,DTable);
  if (local_e8 - 1 < 0xffffffffffffff88) {
    if (local_c8.ip[0] < local_c8.ilimit) {
      __assert_fail("args.ip[0] >= args.ilimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x928e,
                    "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    pBVar13 = (BYTE *)((long)cSrc + 6);
    HUF_decompress4X2_usingDTable_internal_fast_c_loop(&local_c8);
    if (local_c8.ip[0] < pBVar13) {
      __assert_fail("args.ip[0] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9292,
                    "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (local_c8.ip[1] < pBVar13) {
      __assert_fail("args.ip[1] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9293,
                    "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (local_c8.ip[2] < pBVar13) {
      __assert_fail("args.ip[2] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9294,
                    "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    if (local_c8.ip[3] < pBVar13) {
      __assert_fail("args.ip[3] >= iend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9295,
                    "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    pBVar13 = (BYTE *)((long)dst + dstSize);
    if (pBVar13 < local_c8.op[3]) {
      __assert_fail("args.op[3] <= oend",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x9296,
                    "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                   );
    }
    uVar6 = dstSize + 3 >> 2;
    lVar9 = 0;
    while( true ) {
      uVar7 = (long)pBVar13 - (long)dst;
      dst = (BYTE *)((long)dst + uVar6);
      if (uVar7 < uVar6) {
        dst = pBVar13;
      }
      pBVar2 = local_c8.op[lVar9];
      local_e8 = 0xffffffffffffffec;
      if ((dst < pBVar2) ||
         (plVar10 = (long *)local_c8.ip[lVar9], plVar10 < local_c8.iend[lVar9] + -8)) break;
      lVar15 = *plVar10;
      uVar8 = 0;
      for (uVar7 = local_c8.bits[lVar9]; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000)
      {
        uVar8 = uVar8 + 1;
      }
      plVar1 = (long *)((long)local_c8.iend[0] + 8);
      iVar11 = (int)local_c8.iend[0];
      pBVar14 = pBVar2;
      if (7 < (ulong)((long)dst - (long)pBVar2)) {
        do {
          if (plVar10 < plVar1) {
            if (plVar10 == (long *)local_c8.iend[0]) goto LAB_001be2cb;
            uVar16 = uVar8 >> 3 & 0x1fffffff;
            bVar17 = local_c8.iend[0] <= (long *)((long)plVar10 - uVar16);
            uVar7 = (ulong)(uint)((int)plVar10 - iVar11);
            if (bVar17) {
              uVar7 = uVar16;
            }
            uVar12 = (uint)uVar8 + (int)uVar7 * -8;
          }
          else {
            uVar7 = uVar8 >> 3 & 0x1fffffff;
            uVar12 = (uint)uVar8 & 7;
            bVar17 = true;
          }
          uVar8 = (ulong)uVar12;
          plVar10 = (long *)((long)plVar10 - uVar7);
          lVar15 = *plVar10;
          if (((BYTE *)((long)dst + -9) <= pBVar14) || (!bVar17)) goto LAB_001be2cb;
          uVar7 = (ulong)(lVar15 << (uVar8 & 0x3f)) >> 0x35;
          *(short *)pBVar14 = (short)DTable[uVar7 + 1];
          uVar12 = *(byte *)((long)DTable + uVar7 * 4 + 6) + uVar12;
          uVar7 = (ulong)*(byte *)((long)DTable + uVar7 * 4 + 7);
          uVar8 = (ulong)(lVar15 << ((ulong)uVar12 & 0x3f)) >> 0x35;
          *(short *)(pBVar14 + uVar7) = (short)DTable[uVar8 + 1];
          uVar12 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar12;
          uVar8 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
          lVar4 = uVar8 + uVar7;
          uVar16 = (ulong)(lVar15 << ((ulong)uVar12 & 0x3f)) >> 0x35;
          *(short *)(pBVar14 + uVar8 + uVar7) = (short)DTable[uVar16 + 1];
          uVar12 = *(byte *)((long)DTable + uVar16 * 4 + 6) + uVar12;
          uVar7 = (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7);
          lVar5 = uVar7 + lVar4;
          uVar8 = (ulong)(lVar15 << ((ulong)uVar12 & 0x3f)) >> 0x35;
          *(short *)(pBVar14 + uVar7 + lVar4) = (short)DTable[uVar8 + 1];
          uVar12 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar12;
          uVar7 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
          uVar16 = (ulong)(lVar15 << ((ulong)uVar12 & 0x3f)) >> 0x35;
          *(short *)(pBVar14 + uVar7 + lVar5) = (short)DTable[uVar16 + 1];
          uVar12 = *(byte *)((long)DTable + uVar16 * 4 + 6) + uVar12;
          uVar8 = (ulong)uVar12;
          pBVar14 = pBVar14 + (ulong)*(byte *)((long)DTable + uVar16 * 4 + 7) + uVar7 + lVar5;
          if (0x40 < uVar12) goto LAB_001be2cb;
        } while( true );
      }
      if (plVar10 < plVar1) {
        if (plVar10 != (long *)local_c8.iend[0]) {
          uVar16 = uVar8 >> 3 & 0x1fffffff;
          uVar7 = (ulong)(uint)((int)plVar10 - iVar11);
          if (local_c8.iend[0] <= (long *)((long)plVar10 - uVar16)) {
            uVar7 = uVar16;
          }
          uVar12 = (uint)uVar8 + (int)uVar7 * -8;
          goto LAB_001be2c2;
        }
      }
      else {
        uVar7 = uVar8 >> 3 & 0x1fffffff;
        uVar12 = (uint)uVar8 & 7;
LAB_001be2c2:
        uVar8 = (ulong)uVar12;
        plVar10 = (long *)((long)plVar10 - uVar7);
        lVar15 = *plVar10;
      }
LAB_001be2cb:
      if (1 < (ulong)((long)dst - (long)pBVar14)) {
        while (uVar12 = (uint)uVar8, uVar12 < 0x41) {
          if (plVar10 < plVar1) {
            if (plVar10 == (long *)local_c8.iend[0]) break;
            uVar8 = uVar8 >> 3 & 0x1fffffff;
            bVar17 = local_c8.iend[0] <= (long *)((long)plVar10 - uVar8);
            uVar7 = (ulong)(uint)((int)plVar10 - iVar11);
            if (bVar17) {
              uVar7 = uVar8;
            }
            uVar12 = uVar12 + (int)uVar7 * -8;
          }
          else {
            uVar7 = uVar8 >> 3 & 0x1fffffff;
            uVar12 = uVar12 & 7;
            bVar17 = true;
          }
          uVar8 = (ulong)uVar12;
          plVar10 = (long *)((long)plVar10 - uVar7);
          lVar15 = *plVar10;
          if (((BYTE *)((long)dst + -2) < pBVar14) || (!bVar17)) break;
          uVar7 = (ulong)(lVar15 << (uVar8 & 0x3f)) >> 0x35;
          *(short *)pBVar14 = (short)DTable[uVar7 + 1];
          pBVar14 = pBVar14 + *(byte *)((long)DTable + uVar7 * 4 + 7);
          uVar8 = (ulong)(*(byte *)((long)DTable + uVar7 * 4 + 6) + uVar12);
        }
        for (; pBVar14 <= (BYTE *)((long)dst + -2);
            pBVar14 = pBVar14 + *(byte *)((long)DTable + uVar7 * 4 + 7)) {
          uVar7 = (ulong)(lVar15 << (uVar8 & 0x3f)) >> 0x35;
          *(short *)pBVar14 = (short)DTable[uVar7 + 1];
          uVar8 = (ulong)((uint)*(byte *)((long)DTable + uVar7 * 4 + 6) + (int)uVar8);
        }
      }
      if (pBVar14 < dst) {
        *pBVar14 = (BYTE)DTable[((ulong)(lVar15 << (uVar8 & 0x3f)) >> 0x35) + 1];
        pBVar14 = pBVar14 + 1;
      }
      pBVar3 = local_c8.op[lVar9];
      local_c8.op[lVar9] = pBVar14 + ((long)pBVar3 - (long)pBVar2);
      if (pBVar14 + ((long)pBVar3 - (long)pBVar2) != (BYTE *)dst) {
        return 0xffffffffffffffec;
      }
      lVar9 = lVar9 + 1;
      if (lVar9 == 4) {
        return dstSize;
      }
    }
  }
  return local_e8;
}

Assistant:

static HUF_FAST_BMI2_ATTRS size_t
HUF_decompress4X2_usingDTable_internal_fast(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable,
    HUF_DecompressFastLoopFn loopFn) {
    void const* dt = DTable + 1;
    const BYTE* const iend = (const BYTE*)cSrc + 6;
    BYTE* const oend = (BYTE*)dst + dstSize;
    HUF_DecompressFastArgs args;
    {
        size_t const ret = HUF_DecompressFastArgs_init(&args, dst, dstSize, cSrc, cSrcSize, DTable);
        FORWARD_IF_ERROR(ret, "Failed to init asm args");
        if (ret == 0)
            return 0;
    }

    assert(args.ip[0] >= args.ilimit);
    loopFn(&args);

    /* note : op4 already verified within main loop */
    assert(args.ip[0] >= iend);
    assert(args.ip[1] >= iend);
    assert(args.ip[2] >= iend);
    assert(args.ip[3] >= iend);
    assert(args.op[3] <= oend);
    (void)iend;

    /* finish bitStreams one by one */
    {
        size_t const segmentSize = (dstSize+3) / 4;
        BYTE* segmentEnd = (BYTE*)dst;
        int i;
        for (i = 0; i < 4; ++i) {
            BIT_DStream_t bit;
            if (segmentSize <= (size_t)(oend - segmentEnd))
                segmentEnd += segmentSize;
            else
                segmentEnd = oend;
            FORWARD_IF_ERROR(HUF_initRemainingDStream(&bit, &args, i, segmentEnd), "corruption");
            args.op[i] += HUF_decodeStreamX2(args.op[i], &bit, segmentEnd, (HUF_DEltX2 const*)dt, HUF_DECODER_FAST_TABLELOG);
            if (args.op[i] != segmentEnd)
                return ERROR(corruption_detected);
        }
    }

    /* decoded size */
    return dstSize;
}